

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkDfsReverseNodesContained(Abc_Ntk_t *pNtk,Abc_Obj_t **ppNodes,int nNodes)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  void *pvVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *p_00;
  int local_4c;
  int nLevels;
  int m;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int nNodes_local;
  Abc_Obj_t **ppNodes_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkLevel(pNtk);
  Abc_NtkIncrementTravId(pNtk);
  p = Vec_PtrStart(iVar1 + 2);
  for (m = 0; m < nNodes; m = m + 1) {
    pAVar4 = ppNodes[m];
    iVar2 = Abc_ObjIsCi(pAVar4);
    if (iVar2 == 0) {
      __assert_fail("Abc_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x157,
                    "Vec_Ptr_t *Abc_NtkDfsReverseNodesContained(Abc_Ntk_t *, Abc_Obj_t **, int)");
    }
    Abc_NodeSetTravIdCurrent(pAVar4);
    if (*(uint *)&pAVar4->field_0x14 >> 0xc != 0) {
      __assert_fail("pObj->Level == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x15a,
                    "Vec_Ptr_t *Abc_NtkDfsReverseNodesContained(Abc_Ntk_t *, Abc_Obj_t **, int)");
    }
    pvVar3 = Vec_PtrEntry(p,*(uint *)&pAVar4->field_0x14 >> 0xc);
    (pAVar4->field_6).pTemp = pvVar3;
    Vec_PtrWriteEntry(p,*(uint *)&pAVar4->field_0x14 >> 0xc,pAVar4);
  }
  m = 0;
  do {
    if (iVar1 < m) {
      return p;
    }
    for (pFanout = (Abc_Obj_t *)Vec_PtrEntry(p,m); pFanout != (Abc_Obj_t *)0x0;
        pFanout = (pFanout->field_6).pCopy) {
      for (nLevels = 0; iVar2 = Abc_ObjFanoutNum(pFanout), nLevels < iVar2; nLevels = nLevels + 1) {
        pAVar4 = Abc_ObjFanout(pFanout,nLevels);
        iVar2 = Abc_NodeIsTravIdCurrent(pAVar4);
        if (iVar2 == 0) {
          for (local_4c = 0; iVar2 = Abc_ObjFaninNum(pAVar4), local_4c < iVar2;
              local_4c = local_4c + 1) {
            p_00 = Abc_ObjFanin(pAVar4,local_4c);
            iVar2 = Abc_NodeIsTravIdCurrent(p_00);
            if (iVar2 == 0) break;
          }
          iVar2 = Abc_ObjFaninNum(pAVar4);
          if (iVar2 <= local_4c) {
            Abc_NodeSetTravIdCurrent(pAVar4);
            iVar2 = Abc_ObjIsCo(pAVar4);
            if (iVar2 != 0) {
              *(uint *)&pAVar4->field_0x14 =
                   *(uint *)&pAVar4->field_0x14 & 0xfff | (iVar1 + 1) * 0x1000;
            }
            pvVar3 = Vec_PtrEntry(p,*(uint *)&pAVar4->field_0x14 >> 0xc);
            (pAVar4->field_6).pTemp = pvVar3;
            Vec_PtrWriteEntry(p,*(uint *)&pAVar4->field_0x14 >> 0xc,pAVar4);
            iVar2 = Abc_ObjIsCo(pAVar4);
            if (iVar2 != 0) {
              *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xfff;
            }
          }
        }
      }
    }
    m = m + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsReverseNodesContained( Abc_Ntk_t * pNtk, Abc_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanout, * pFanin;
    int i, k, m, nLevels;
    // set the levels
    nLevels = Abc_NtkLevel( pNtk );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrStart( nLevels + 2 );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = ppNodes[i];
        assert( Abc_ObjIsCi(pObj) );
        Abc_NodeSetTravIdCurrent( pObj );
        // add to the array
        assert( pObj->Level == 0 );
        pObj->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vNodes, pObj->Level );
        Vec_PtrWriteEntry( vNodes, pObj->Level, pObj );
    }
    // iterate through the levels
    for ( i = 0; i <= nLevels; i++ )
    {
        // iterate through the nodes on each level
        for ( pObj = (Abc_Obj_t *)Vec_PtrEntry(vNodes, i); pObj; pObj = pObj->pCopy )
        {
            // iterate through the fanouts of each node
            Abc_ObjForEachFanout( pObj, pFanout, k )
            {
                // skip visited nodes
                if ( Abc_NodeIsTravIdCurrent(pFanout) )
                    continue;
                // visit the fanins of this fanout
                Abc_ObjForEachFanin( pFanout, pFanin, m )
                {
                    if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                        break;
                }
                if ( m < Abc_ObjFaninNum(pFanout) )
                    continue;
                // all fanins are already collected

                // mark the node as visited
                Abc_NodeSetTravIdCurrent( pFanout );
                // handle the COs
                if ( Abc_ObjIsCo(pFanout) )
                    pFanout->Level = nLevels + 1;
                // add to the array
                pFanout->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vNodes, pFanout->Level );
                Vec_PtrWriteEntry( vNodes, pFanout->Level, pFanout );
                // handle the COs
                if ( Abc_ObjIsCo(pFanout) )
                    pFanout->Level = 0;
            }
        }
    }
    return vNodes;
}